

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecoder::InitPredictionScheme
          (SequentialAttributeDecoder *this,PredictionSchemeInterface *ps)

{
  uint16_t uVar1;
  int iVar2;
  int32_t iVar3;
  PointCloud *this_00;
  PointAttribute *pPVar4;
  ulong uVar5;
  long *in_RSI;
  long in_RDI;
  PointAttribute *pa;
  int att_id;
  int i;
  long *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar6;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar6 = local_1c;
    iVar2 = (**(code **)(*in_RSI + 0x28))();
    if (iVar2 <= iVar6) {
      return true;
    }
    this_00 = PointCloudDecoder::point_cloud(*(PointCloudDecoder **)(in_RDI + 8));
    (**(code **)(*in_RSI + 0x30))(in_RSI,local_1c);
    iVar3 = PointCloud::GetNamedAttributeId
                      (this_00,(Type)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    if (iVar3 == -1) break;
    uVar1 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
    if (uVar1 < 0x200) {
      PointCloudDecoder::point_cloud(*(PointCloudDecoder **)(in_RDI + 8));
      pPVar4 = PointCloud::attribute(this_00,(int32_t)((ulong)in_RSI >> 0x20));
      uVar5 = (**(code **)(*in_RSI + 0x38))(in_RSI,pPVar4);
      in_stack_ffffffffffffffb8 = in_RSI;
      if ((uVar5 & 1) == 0) {
        return false;
      }
    }
    else {
      pPVar4 = PointCloudDecoder::GetPortableAttribute
                         ((PointCloudDecoder *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          (int32_t)((ulong)this_00 >> 0x20));
      if ((pPVar4 == (PointAttribute *)0x0) ||
         (uVar5 = (**(code **)(*in_RSI + 0x38))(in_RSI,pPVar4), (uVar5 & 1) == 0)) {
        return false;
      }
    }
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool SequentialAttributeDecoder::InitPredictionScheme(
    PredictionSchemeInterface *ps) {
  for (int i = 0; i < ps->GetNumParentAttributes(); ++i) {
    const int att_id = decoder_->point_cloud()->GetNamedAttributeId(
        ps->GetParentAttributeType(i));
    if (att_id == -1) {
      return false;  // Requested attribute does not exist.
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!ps->SetParentAttribute(decoder_->point_cloud()->attribute(att_id))) {
        return false;
      }
    } else
#endif
    {
      const PointAttribute *const pa = decoder_->GetPortableAttribute(att_id);
      if (pa == nullptr || !ps->SetParentAttribute(pa)) {
        return false;
      }
    }
  }
  return true;
}